

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilProgress.c
# Opt level: O0

void Extra_ProgressBarUpdate_int(ProgressBar *p,int nItemsCur,char *pString)

{
  char *pString_local;
  int nItemsCur_local;
  ProgressBar *p_local;
  
  if ((p != (ProgressBar *)0x0) && (p->nItemsNext <= nItemsCur)) {
    if (nItemsCur < p->nItemsTotal) {
      p->posCur = p->posCur + 7;
      p->nItemsNext =
           (int)((((double)p->posCur + 7.0) * (double)p->nItemsTotal) / (double)p->posTotal);
    }
    else {
      p->posCur = 0x4e;
      p->nItemsNext = 0x7fffffff;
    }
    Extra_ProgressBarShow(p,pString);
  }
  return;
}

Assistant:

void Extra_ProgressBarUpdate_int( ProgressBar * p, int nItemsCur, char * pString )
{
    if ( p == NULL ) return;
    if ( nItemsCur < p->nItemsNext )
        return;
    if ( nItemsCur >= p->nItemsTotal )
    {
        p->posCur = 78;
        p->nItemsNext = 0x7FFFFFFF;
    }
    else
    {
        p->posCur += 7;
        p->nItemsNext = (int)((7.0+p->posCur)*p->nItemsTotal/p->posTotal);
    }
    Extra_ProgressBarShow( p, pString );
}